

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::XMLNode::DeleteChildren(XMLNode *this)

{
  XMLNode *child;
  MemPool *pMVar1;
  
  child = this->_firstChild;
  while (child != (XMLNode *)0x0) {
    Unlink(this,child);
    pMVar1 = child->_memPool;
    (*child->_vptr_XMLNode[0xf])(child);
    (*pMVar1->_vptr_MemPool[4])(pMVar1,child);
    child = this->_firstChild;
  }
  this->_firstChild = (XMLNode *)0x0;
  this->_lastChild = (XMLNode *)0x0;
  return;
}

Assistant:

void XMLNode::DeleteChildren()
{
    while( _firstChild ) {
        TIXMLASSERT( _lastChild );
        DeleteChild( _firstChild );
    }
    _firstChild = _lastChild = 0;
}